

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O3

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  long *local_38 [2];
  long local_28 [2];
  
  bVar5 = false;
  lVar3 = std::__cxx11::string::find((char *)content_type,0x136599,0);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)content_type);
    std::__cxx11::string::operator=((string *)boundary,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    uVar1 = boundary->_M_string_length;
    uVar4 = uVar1;
    if (1 < uVar1) {
      pcVar2 = (boundary->_M_dataplus)._M_p;
      uVar4 = 1;
      if ((*pcVar2 == '\"') && (pcVar2[uVar1 - 1] == '\"')) {
        std::__cxx11::string::substr((ulong)local_38,(ulong)boundary);
        std::__cxx11::string::operator=((string *)boundary,(string *)local_38);
        if (local_38[0] != local_28) {
          operator_delete(local_38[0],local_28[0] + 1);
        }
        uVar4 = boundary->_M_string_length;
      }
    }
    bVar5 = uVar4 != 0;
  }
  return bVar5;
}

Assistant:

inline bool parse_multipart_boundary(const std::string& content_type,
            std::string& boundary) {
            auto pos = content_type.find("boundary=");
            if (pos == std::string::npos) { return false; }
            boundary = content_type.substr(pos + 9);
            if (boundary.length() >= 2 && boundary.front() == '"' &&
                boundary.back() == '"') {
                boundary = boundary.substr(1, boundary.size() - 2);
            }
            return !boundary.empty();
        }